

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O1

void __thiscall EventNotValid::~EventNotValid(EventNotValid *this)

{
  pointer pcVar1;
  
  *(undefined ***)&this->super_EventError = &PTR__EventError_00121760;
  pcVar1 = (this->super_EventError).reason._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_EventError).reason.field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception((exception *)this);
  operator_delete(this);
  return;
}

Assistant:

EventNotValid(std::string reason) : EventError(reason){

    }